

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::DateTruncBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  DatePartSpecifier type;
  LogicalTypeId LVar2;
  pointer pEVar3;
  ulong uVar4;
  type pEVar5;
  reference pvVar6;
  function_statistics_t p_Var7;
  NotImplementedException *pNVar8;
  long in_RDX;
  Expression *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  DatePartSpecifier part_code;
  string part_name;
  Value part_value;
  LogicalType *in_stack_fffffffffffffe68;
  LogicalType *in_stack_fffffffffffffe70;
  allocator *paVar9;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffe90;
  DatePartSpecifier in_stack_fffffffffffffebf;
  allocator local_f9;
  string local_f8 [32];
  LogicalType local_d8 [30];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [39];
  byte local_91;
  string local_90 [32];
  undefined4 local_70;
  ClientContext local_60 [72];
  long local_18;
  Expression *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffe70);
  uVar4 = (**(code **)(*(long *)pEVar3 + 0x78))();
  if ((uVar4 & 1) == 0) {
    unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<std::default_delete<duckdb::FunctionData>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  else {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffffe70);
    duckdb::ExpressionExecutor::EvaluateScalar(local_60,local_10,SUB81(pEVar5,0));
    bVar1 = Value::IsNull((Value *)local_60);
    if (bVar1) {
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<std::default_delete<duckdb::FunctionData>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      local_70 = 1;
    }
    else {
      duckdb::Value::ToString_abi_cxx11_();
      local_91 = duckdb::GetDatePartSpecifier(local_90);
      if (((local_91 < 6) || ((byte)(local_91 - 0xb) < 7)) || (local_91 == 0x17)) {
        pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                           ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe70,
                            (size_type)in_stack_fffffffffffffe68);
        type = LogicalType::id(pvVar6);
        if (type == QUARTER) {
          std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=(in_stack_fffffffffffffe90,
                    (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                    CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
          p_Var7 = __duckdb__DateTruncStats<duckdb::date_t,duckdb::date_t>_duckdb__DatePartSpecifier__
                             (type);
          *(function_statistics_t *)(local_18 + 0xe8) = p_Var7;
        }
        else {
          if (type != TIMEZONE) {
            local_ba = 1;
            pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b8,"Temporal argument type for DATETRUNC",&local_b9);
            duckdb::NotImplementedException::NotImplementedException(pNVar8,local_b8);
            local_ba = 0;
            __cxa_throw(pNVar8,&NotImplementedException::typeinfo,
                        NotImplementedException::~NotImplementedException);
          }
          std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=(in_stack_fffffffffffffe90,
                    (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                    CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
          p_Var7 = __duckdb__DateTruncStats<duckdb::timestamp_t,duckdb::date_t>_duckdb__DatePartSpecifier__
                             (type);
          *(function_statistics_t *)(local_18 + 0xe8) = p_Var7;
        }
        duckdb::LogicalType::LogicalType(local_d8,DATE);
        LogicalType::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        duckdb::LogicalType::~LogicalType(local_d8);
      }
      else {
        pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                           ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe70,
                            (size_type)in_stack_fffffffffffffe68);
        LVar2 = LogicalType::id(pvVar6);
        if (LVar2 == DATE) {
          p_Var7 = __duckdb__DateTruncStats<duckdb::date_t,duckdb::timestamp_t>_duckdb__DatePartSpecifier__
                             (in_stack_fffffffffffffebf);
          *(function_statistics_t *)(local_18 + 0xe8) = p_Var7;
        }
        else {
          if (LVar2 != TIMESTAMP) {
            pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            paVar9 = &local_f9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f8,"Temporal argument type for DATETRUNC",paVar9);
            duckdb::NotImplementedException::NotImplementedException(pNVar8,local_f8);
            __cxa_throw(pNVar8,&NotImplementedException::typeinfo,
                        NotImplementedException::~NotImplementedException);
          }
          p_Var7 = __duckdb__DateTruncStats<duckdb::timestamp_t,duckdb::timestamp_t>_duckdb__DatePartSpecifier__
                             (in_stack_fffffffffffffebf);
          *(function_statistics_t *)(local_18 + 0xe8) = p_Var7;
        }
      }
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<std::default_delete<duckdb::FunctionData>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      local_70 = 1;
      std::__cxx11::string::~string(local_90);
    }
    duckdb::Value::~Value((Value *)local_60);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> DateTruncBind(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	if (!arguments[0]->IsFoldable()) {
		return nullptr;
	}

	// Rebind to return a date if we are truncating that far
	Value part_value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	if (part_value.IsNull()) {
		return nullptr;
	}
	const auto part_name = part_value.ToString();
	const auto part_code = GetDatePartSpecifier(part_name);
	switch (part_code) {
	case DatePartSpecifier::MILLENNIUM:
	case DatePartSpecifier::CENTURY:
	case DatePartSpecifier::DECADE:
	case DatePartSpecifier::YEAR:
	case DatePartSpecifier::QUARTER:
	case DatePartSpecifier::MONTH:
	case DatePartSpecifier::WEEK:
	case DatePartSpecifier::YEARWEEK:
	case DatePartSpecifier::ISOYEAR:
	case DatePartSpecifier::DAY:
	case DatePartSpecifier::DOW:
	case DatePartSpecifier::ISODOW:
	case DatePartSpecifier::DOY:
	case DatePartSpecifier::JULIAN_DAY:
		switch (bound_function.arguments[1].id()) {
		case LogicalType::TIMESTAMP:
			bound_function.function = DateTruncFunction<timestamp_t, date_t>;
			bound_function.statistics = DateTruncStats<timestamp_t, date_t>(part_code);
			break;
		case LogicalType::DATE:
			bound_function.function = DateTruncFunction<date_t, date_t>;
			bound_function.statistics = DateTruncStats<date_t, date_t>(part_code);
			break;
		default:
			throw NotImplementedException("Temporal argument type for DATETRUNC");
		}
		bound_function.return_type = LogicalType::DATE;
		break;
	default:
		switch (bound_function.arguments[1].id()) {
		case LogicalType::TIMESTAMP:
			bound_function.statistics = DateTruncStats<timestamp_t, timestamp_t>(part_code);
			break;
		case LogicalType::DATE:
			bound_function.statistics = DateTruncStats<date_t, timestamp_t>(part_code);
			break;
		default:
			throw NotImplementedException("Temporal argument type for DATETRUNC");
		}
		break;
	}

	return nullptr;
}